

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

void nng_http_get_body(nng_http *conn,void **datap,size_t *lenp)

{
  nni_http_get_body(conn,datap,lenp);
  return;
}

Assistant:

void
nng_http_get_body(nng_http *conn, void **datap, size_t *lenp)
{
#ifdef NNG_SUPP_HTTP
	nni_http_get_body(conn, datap, lenp);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(datap);
	NNI_ARG_UNUSED(lenp);
#endif
}